

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

int parse_matrix_parameters(char **begin,char *end,float *values,int required,int optional)

{
  uint uVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  uint uVar5;
  char *it;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pbVar6 = (byte *)*begin;
  bVar10 = pbVar6 < end;
  pbVar7 = pbVar6;
  if (bVar10) {
    bVar10 = true;
    do {
      pbVar7 = pbVar6;
      if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
      pbVar6 = pbVar6 + 1;
      bVar10 = pbVar6 < end;
      pbVar7 = (byte *)end;
    } while (pbVar6 != (byte *)end);
  }
  uVar1 = 0;
  if (bVar10) {
    bVar10 = false;
    if (pbVar7 < end) {
      bVar10 = *pbVar7 == 0x28;
      pbVar7 = pbVar7 + bVar10;
    }
    uVar1 = 0;
    if (bVar10) {
      pbVar6 = pbVar7;
      if (pbVar7 < end) {
        do {
          pbVar6 = pbVar7;
          if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))
          break;
          pbVar7 = pbVar7 + 1;
          pbVar6 = (byte *)end;
        } while (pbVar7 != (byte *)end);
      }
      *begin = (char *)pbVar6;
      if (pbVar6 < end) {
        uVar5 = optional + required;
        if (uVar5 == 0 || SCARRY4(optional,required) != (int)uVar5 < 0) {
          bVar10 = false;
          uVar8 = 0;
        }
        else {
          uVar9 = 0;
          bVar10 = false;
          do {
            pbVar6 = (byte *)*begin;
            if (pbVar6 < end) {
              if (*pbVar6 != 0x2d) {
                if (*pbVar6 == 0x2b) {
                  pbVar6 = pbVar6 + 1;
                }
                goto LAB_00108a2e;
              }
              pbVar6 = pbVar6 + 1;
              fVar11 = -1.0;
            }
            else {
LAB_00108a2e:
              fVar11 = 1.0;
            }
            if ((end <= pbVar6) || (bVar2 = *pbVar6 - 0x30, *pbVar6 != 0x2e && 9 < bVar2))
            goto LAB_00108cb3;
            fVar14 = 0.0;
            if (bVar2 < 10) {
              pcVar3 = end + ~(ulong)pbVar6;
              fVar13 = 0.0;
              pbVar7 = pbVar6;
              do {
                fVar13 = fVar13 * 10.0 + (float)((char)*pbVar7 + -0x30);
                pbVar6 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                pbVar4 = pbVar7 + 1;
                pbVar6 = pbVar7 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar7 = pbVar6;
              } while ((byte)(*pbVar4 - 0x30) < 10);
            }
            else {
              fVar13 = 0.0;
            }
            if ((pbVar6 < end) && (*pbVar6 == 0x2e)) {
              pbVar7 = pbVar6 + 1;
              if ((end <= pbVar7) || (9 < (byte)(*pbVar7 - 0x30))) goto LAB_00108cb3;
              pcVar3 = end + (-2 - (long)pbVar6);
              fVar14 = 0.0;
              fVar12 = 1.0;
              do {
                fVar14 = fVar14 * 10.0 + (float)((char)*pbVar7 + -0x30);
                fVar12 = fVar12 * 10.0;
                pbVar6 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                pbVar4 = pbVar7 + 1;
                pbVar6 = pbVar7 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar7 = pbVar6;
              } while ((byte)(*pbVar4 - 0x30) < 10);
              fVar14 = fVar14 / fVar12;
            }
            fVar12 = 0.0;
            if ((pbVar6 < end) && ((*pbVar6 | 0x20) == 0x65)) {
              pbVar7 = pbVar6 + 1;
              pbVar4 = pbVar7;
              if (pbVar7 < end) {
                bVar2 = *pbVar7;
                pbVar4 = pbVar6 + 2;
                if (bVar2 == 0x2b) goto LAB_00108b48;
                pbVar4 = pbVar7;
                if (bVar2 == 0x2d) {
                  pbVar4 = pbVar6 + 2;
                }
                fVar15 = *(float *)(&DAT_001237cc + (ulong)(bVar2 == 0x2d) * 4);
              }
              else {
LAB_00108b48:
                fVar15 = 1.0;
              }
              if ((end <= pbVar4) || (9 < (byte)(*pbVar4 - 0x30))) goto LAB_00108cb3;
              pcVar3 = end + ~(ulong)pbVar4;
              do {
                fVar12 = fVar12 * 10.0 + (float)((char)*pbVar4 + -0x30);
                pbVar6 = (byte *)end;
                if (pcVar3 == (char *)0x0) break;
                pbVar7 = pbVar4 + 1;
                pbVar6 = pbVar4 + 1;
                pcVar3 = pcVar3 + -1;
                pbVar4 = pbVar6;
              } while ((byte)(*pbVar7 - 0x30) < 10);
            }
            else {
              fVar15 = 1.0;
            }
            *begin = (char *)pbVar6;
            values[uVar9] = fVar11 * (fVar13 + fVar14);
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              fVar11 = powf(10.0,fVar12 * fVar15);
              values[uVar9] = fVar11 * values[uVar9];
            }
            if (3.4028235e+38 < ABS(values[uVar9])) goto LAB_00108cb3;
            pbVar6 = (byte *)*begin;
            bVar10 = pbVar6 < end;
            pbVar7 = pbVar6;
            if (bVar10) {
              bVar10 = true;
              pbVar4 = pbVar6;
              do {
                pbVar7 = pbVar4;
                if ((0x20 < (ulong)*pbVar4) || ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) == 0))
                break;
                pbVar4 = pbVar4 + 1;
                bVar10 = pbVar4 < end;
                pbVar7 = (byte *)end;
              } while (pbVar4 != (byte *)end);
            }
            if (bVar10) {
              bVar10 = false;
              if (pbVar7 < end) {
                bVar10 = *pbVar7 == 0x2c;
                pbVar7 = pbVar7 + bVar10;
              }
              if (!bVar10) goto LAB_00108c26;
              bVar10 = true;
              pbVar4 = pbVar7;
              if (pbVar7 < end) {
                do {
                  pbVar4 = pbVar7;
                  if ((0x20 < (ulong)*pbVar7) ||
                     ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
                  pbVar7 = pbVar7 + 1;
                  pbVar4 = (byte *)end;
                } while (pbVar7 != (byte *)end);
              }
            }
            else {
LAB_00108c26:
              bVar10 = false;
              pbVar4 = pbVar7;
            }
            if (pbVar4 != pbVar6) {
              *begin = (char *)pbVar4;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar5);
          uVar9 = (ulong)uVar5;
LAB_00108cb3:
          uVar8 = (uint)uVar9;
        }
        uVar1 = 0;
        if ((((!bVar10) && (uVar8 == required || uVar8 == uVar5)) && (pcVar3 = *begin, pcVar3 < end)
            ) && (*pcVar3 == ')')) {
          *begin = pcVar3 + 1;
          uVar1 = uVar8;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

static int parse_matrix_parameters(const char** begin, const char* end, float values[6], int required, int optional)
{
    if(!plutovg_skip_ws_and_delim(begin, end, '('))
        return 0;
    int count = 0;
    int max_count = required + optional;
    bool has_trailing_comma = false;
    for(; count < max_count; ++count) {
        if(!plutovg_parse_number(begin, end, values + count))
            break;
        plutovg_skip_ws_or_comma(begin, end, &has_trailing_comma);
    }

    if(!has_trailing_comma && (count == required || count == max_count)
        && plutovg_skip_delim(begin, end, ')')) {
        return count;
    }

    return 0;
}